

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_get_channel_max(OPEN_HANDLE open,uint16_t *channel_max_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  OPEN_INSTANCE *open_instance;
  uint32_t item_count;
  int result;
  uint16_t *channel_max_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x55a;
  }
  else {
    _item_count = channel_max_value;
    channel_max_value_local = (uint16_t *)open;
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,(uint32_t *)&open_instance);
    if (iVar1 == 0) {
      if ((uint)open_instance < 4) {
        *_item_count = 0xffff;
        open_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(open->composite_value,3);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = 0xffff;
          open_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_ushort(value,_item_count);
          if (iVar1 == 0) {
            open_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = 0xffff;
              open_instance._4_4_ = 0;
            }
            else {
              open_instance._4_4_ = 0x57b;
            }
          }
        }
      }
    }
    else {
      open_instance._4_4_ = 0x562;
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_get_channel_max(OPEN_HANDLE open, uint16_t* channel_max_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 3)
            {
                *channel_max_value = 65535;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 3);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *channel_max_value = 65535;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_ushort(item_value, channel_max_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *channel_max_value = 65535;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}